

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O3

bool __thiscall duckdb::TypeInfo::operator==(TypeInfo *this,TypeInfo *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->alias)._M_string_length;
  if (__n == (other->alias)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->alias)._M_dataplus._M_p,(other->alias)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->type == other->type & bVar2);
}

Assistant:

bool TypeInfo::operator==(const TypeInfo &other) const {
	return alias == other.alias && type == other.type;
}